

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureRunner.cpp
# Opt level: O3

int __thiscall ut11::detail::TestFixtureRunner::Run(TestFixtureRunner *this,Output *output)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long extraout_RDX;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  *__range1;
  shared_ptr<ut11::detail::TestFixtureAbstract> *fixture;
  pointer psVar3;
  long lVar4;
  long lVar5;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  fixtures;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  local_58;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  local_40;
  
  (*output->_vptr_Output[2])(output);
  GetFixtures(&local_40,this);
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::vector(&local_58,&local_40);
  if (local_58.
      super__Vector_base<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = 0;
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    psVar3 = local_58.
             super__Vector_base<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar3->
               super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar2 = (*peVar1->_vptr_TestFixtureAbstract[9])(peVar1,output);
      lVar4 = lVar4 + CONCAT44(extraout_var,iVar2);
      lVar5 = lVar5 + extraout_RDX;
      psVar3 = psVar3 + 1;
    } while (psVar3 != local_58.
                       super__Vector_base<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::~vector(&local_58);
  (*output->_vptr_Output[3])(output,lVar4,lVar5);
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::~vector(&local_40);
  return (int)lVar4 - (int)lVar5;
}

Assistant:

int ut11::detail::TestFixtureRunner::Run(out::Output& output)
{
	output.Begin();

	auto fixtures = GetFixtures();
	auto results = RunTestFixtures(fixtures, output);

	output.Finish(results.ran, results.succeeded);
	return results.ran - results.succeeded;
}